

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O0

bool __thiscall embree::XML::hasChild(XML *this,string *childID)

{
  __type_conflict _Var1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t i;
  ulong local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  
  local_28 = 0;
  __rhs = in_RDI;
  while( true ) {
    sVar2 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::size
                      ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                        *)(in_RDI + 4));
    if (sVar2 <= local_28) {
      return false;
    }
    std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
              ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
               (in_RDI + 4),local_28);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),__rhs);
    if (_Var1) break;
    local_28 = local_28 + 1;
  }
  return true;
}

Assistant:

bool hasChild(const std::string& childID) const 
    {
      for (size_t i=0; i<children.size(); i++)
        if (children[i]->name == childID) return true;
      return false;
    }